

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_FindUniqueTid
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  VMValue *pVVar2;
  char *pcVar3;
  
  if (numparam < 1) {
    pVVar2 = defaultparam->Array;
    if ((pVVar2->field_0).field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_0042e536;
    }
  }
  else {
    pVVar2 = param;
    if ((param->field_0).field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
LAB_0042e536:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xcfc,
                    "int AF_AActor_FindUniqueTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  if (numparam < 2) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') goto LAB_0042e4a4;
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
LAB_0042e4a4:
      iVar1 = P_FindUniqueTID((pVVar2->field_0).i,param[1].field_0.i);
      if (numret < 1) {
        iVar1 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0xcfe,
                        "int AF_AActor_FindUniqueTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (ret->RegType != '\0') {
          __assert_fail("RegType == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x13f,"void VMReturn::SetInt(int)");
        }
        *(int *)ret->Location = iVar1;
        iVar1 = 1;
      }
      return iVar1;
    }
    pcVar3 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0xcfd,
                "int AF_AActor_FindUniqueTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, FindUniqueTid)
{
	PARAM_PROLOGUE;
	PARAM_INT_DEF(start);
	PARAM_INT_DEF(limit);
	ACTION_RETURN_INT(P_FindUniqueTID(start, limit));
}